

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

transformData * newTransformation(char *rec)

{
  transformData *local_20;
  transformData *xform;
  char *rec_local;
  
  local_20 = (transformData *)0x0;
  if (rec != (char *)0x0) {
    local_20 = (transformData *)malloc(0x108);
    if (local_20 == (transformData *)0x0) {
      warn("could not create transformation");
      return (transformData *)0x0;
    }
    local_20->next = (transformdata_t *)0x0;
    local_20->recs = (xformAtomRecords *)0x0;
    local_20->lastrec = (xformAtomRecords *)0x0;
    local_20->funcs = (biasFunction *)0x0;
    fillinTransformationRec(local_20,rec);
  }
  return local_20;
}

Assistant:

transformData* newTransformation(char* rec) {
   transformData* xform = NULL;
   if (rec) {
      xform = (transformData *)malloc(sizeof(transformData));
      if (!xform) {
         warn("could not create transformation");
         return NULL;
      }
      xform->next    = NULL;
      xform->recs    = NULL;
      xform->lastrec = NULL;

      xform->funcs   = NULL;

      fillinTransformationRec(xform, rec);
   }
   return xform;
}